

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O0

bool __thiscall
VWReaderHandler<true>::Key(VWReaderHandler<true> *this,char *str,SizeType len,bool copy)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  byte in_CL;
  uint in_EDX;
  undefined8 in_RSI;
  Context<true> *in_RDI;
  
  iVar2 = (*in_RDI->current_state->_vptr_BaseState[6])
                    (in_RDI->current_state,in_RDI,in_RSI,(ulong)in_EDX,(ulong)(in_CL & 1));
  bVar1 = Context<true>::TransitionState(in_RDI,(BaseState<true> *)CONCAT44(extraout_var,iVar2));
  return bVar1;
}

Assistant:

bool Key(const char* str, SizeType len, bool copy)
  {
    return ctx.TransitionState(ctx.current_state->Key(ctx, str, len, copy));
  }